

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsAddress.cpp
# Opt level: O2

void __thiscall Scs::Address::Log(Address *this)

{
  int __af;
  addrinfo *paVar1;
  char *pcVar2;
  char ipstr [46];
  
  LogWriteLine("Logging addresses...");
  while (paVar1 = this->m_address, paVar1 != (addrinfo *)0x0) {
    __af = paVar1->ai_family;
    pcVar2 = "IPv6";
    if (__af == 2) {
      pcVar2 = "IPv4";
    }
    inet_ntop(__af,paVar1->ai_addr->sa_data + (ulong)(__af != 2) * 4 + 2,ipstr,0x2e);
    LogWriteLine("  %s: %s",pcVar2,ipstr);
    this = (Address *)&paVar1->ai_next;
  }
  return;
}

Assistant:

void Address::Log() const
{
	LogWriteLine("Logging addresses...");
	char ipstr[INET6_ADDRSTRLEN];
	auto curr = m_address;
	while (curr)
	{
        void *addr;
        const char *ipver;		
        // get the pointer to the address itself,
        // different fields in IPv4 and IPv6:
        if (curr->ai_family == AF_INET) // IPv4
		{ 
            struct sockaddr_in *ipv4 = (struct sockaddr_in *)curr->ai_addr;
            addr = &(ipv4->sin_addr);
            ipver = "IPv4";
        } 
		else // IPv6
		{ 
            struct sockaddr_in6 *ipv6 = (struct sockaddr_in6 *)curr->ai_addr;
            addr = &(ipv6->sin6_addr);
            ipver = "IPv6";
        }

        // convert the IP to a string and print it:
        ScsInetNtoP(curr->ai_family, addr, ipstr, countof(ipstr));
        LogWriteLine("  %s: %s", ipver, ipstr);
	
		// Advance to the next address
		curr = curr->ai_next;
	}
}